

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftobjs.c
# Opt level: O3

FT_Error FT_Load_Glyph(FT_Face face,FT_UInt glyph_index,FT_Int32 load_flags)

{
  short sVar1;
  FT_Int FVar2;
  FT_GlyphSlot slot;
  FT_Driver pFVar3;
  FT_Module pFVar4;
  ulong uVar5;
  FT_Size pFVar6;
  FT_Face_Internal pFVar7;
  FT_Library pFVar8;
  FT_Render_Mode render_mode;
  long lVar9;
  long lVar10;
  uint uVar11;
  FT_Error FVar12;
  int iVar13;
  int iVar14;
  FT_Render_Mode FVar15;
  char *pcVar16;
  ulong uVar17;
  FT_Pos FVar18;
  uint uVar19;
  FT_Glyph_Format FVar20;
  FT_Pos FVar21;
  FT_Vector *pFVar22;
  ulong uVar23;
  FT_ListNode pFVar24;
  ulong uVar25;
  FT_Renderer_conflict pFVar26;
  bool bVar27;
  
  if (face == (FT_Face)0x0) {
    return 0x23;
  }
  if (face->size == (FT_Size)0x0) {
    return 0x23;
  }
  slot = face->glyph;
  if (slot == (FT_GlyphSlot)0x0) {
    return 0x23;
  }
  ft_glyphslot_free_bitmap(slot);
  (slot->bitmap).rows = 0;
  (slot->bitmap).width = 0;
  (slot->bitmap).pitch = 0;
  (slot->bitmap).pixel_mode = '\0';
  slot->format = FT_GLYPH_FORMAT_NONE;
  (slot->metrics).width = 0;
  (slot->metrics).height = 0;
  (slot->metrics).horiBearingX = 0;
  (slot->metrics).horiBearingY = 0;
  (slot->metrics).horiAdvance = 0;
  (slot->metrics).vertBearingX = 0;
  (slot->metrics).vertBearingY = 0;
  (slot->metrics).vertAdvance = 0;
  slot->linearHoriAdvance = 0;
  slot->linearVertAdvance = 0;
  slot->bitmap_left = 0;
  slot->bitmap_top = 0;
  (slot->outline).n_contours = 0;
  (slot->outline).n_points = 0;
  *(undefined4 *)&(slot->outline).field_0x4 = 0;
  (slot->outline).points = (FT_Vector *)0x0;
  (slot->outline).tags = (char *)0x0;
  (slot->outline).contours = (short *)0x0;
  (slot->outline).flags = 0;
  *(undefined4 *)&(slot->outline).field_0x24 = 0;
  slot->num_subglyphs = 0;
  slot->subglyphs = (FT_SubGlyph)0x0;
  slot->control_data = (void *)0x0;
  slot->control_len = 0;
  slot->lsb_delta = 0;
  slot->rsb_delta = 0;
  slot->other = (void *)0x0;
  pFVar3 = face->driver;
  pFVar4 = ((pFVar3->root).library)->auto_hinter;
  uVar11 = load_flags | 0x801;
  if (((uint)load_flags >> 10 & 1) == 0) {
    uVar11 = load_flags;
  }
  uVar19 = uVar11 & 0xfffffff1 | 10;
  if ((uVar11 & 1) == 0) {
    uVar19 = uVar11;
  }
  uVar11 = uVar19 & 0xfffffffb;
  if ((uVar19 >> 0x16 & 1) == 0) {
    uVar11 = uVar19;
  }
  if ((((pFVar4 == (FT_Module)0x0) || ((uVar11 & 0x8002) != 0)) ||
      (uVar5 = ((pFVar3->root).clazz)->module_flags, ((uint)uVar5 & 0x300) != 0x100)) ||
     ((uVar17 = face->face_flags, ((uint)uVar17 >> 0xd & 1) != 0 ||
      (((uVar11 >> 0xb & 1) == 0 &&
       (((face->internal->transform_matrix).yx == 0) == ((face->internal->transform_matrix).xx == 0)
       )))))) {
LAB_001313f5:
    FVar12 = (*pFVar3->clazz->load_glyph)(slot,face->size,glyph_index,uVar11);
    if (FVar12 != 0) {
      return FVar12;
    }
    iVar13 = 0;
    if (slot->format == FT_GLYPH_FORMAT_OUTLINE) {
      FVar12 = FT_Outline_Check(&slot->outline);
      if (FVar12 != 0) {
        return FVar12;
      }
      if ((uVar11 & 2) == 0) {
        ft_glyphslot_grid_fit_metrics(slot,(byte)uVar11 & 0x10);
      }
    }
  }
  else {
    if (((uVar11 & 0x20) == 0) && ((uVar5 & 0x400) != 0)) {
      pcVar16 = FT_Get_Font_Format(face);
      pcVar16 = strstr(pcVar16,"Type 1");
      if (pcVar16 == (char *)0x0) {
        bVar27 = false;
      }
      else {
        bVar27 = *(int *)&pFVar3[1].root.clazz == 1;
      }
      if (((uVar11 & 0xf0000) != 0x10000) ||
         ((*(byte *)((long)&((pFVar3->root).clazz)->module_flags + 1) >> 3 & 1) != 0 || bVar27)) {
        uVar17 = face->face_flags;
        if ((((uVar17 & 8) == 0) ||
            (((face[4].sizes_list.tail == (FT_ListNode)0x0 ||
              (*(short *)((long)&face[1].extensions + 6) != 0)) ||
             (*(long *)&face[4].num_fixed_sizes != 0)))) || (*(long *)&face[4].num_charmaps != 0))
        goto LAB_001313f5;
      }
      else {
        uVar17 = face->face_flags;
      }
    }
    if ((((uVar17 & 2) == 0) || ((uVar11 & 8) != 0)) ||
       ((FVar12 = (*pFVar3->clazz->load_glyph)(slot,face->size,glyph_index,uVar11 | 0x4000),
        FVar12 != 0 || (iVar13 = 0, slot->format != FT_GLYPH_FORMAT_BITMAP)))) {
      pFVar7 = face->internal;
      FVar2 = pFVar7->transform_flags;
      pFVar7->transform_flags = 0;
      iVar13 = (**(code **)((long)pFVar4->clazz->module_interface + 0x18))
                         (pFVar4,slot,face->size,glyph_index,uVar11);
      pFVar7->transform_flags = FVar2;
    }
  }
  if ((uVar11 & 0x10) == 0) {
    FVar21 = (slot->metrics).horiAdvance;
    FVar18 = 0;
  }
  else {
    FVar18 = (slot->metrics).vertAdvance;
    FVar21 = 0;
  }
  (slot->advance).x = FVar21;
  (slot->advance).y = FVar18;
  if (((uVar11 >> 0xd & 1) == 0) && ((face->face_flags & 1) != 0)) {
    pFVar6 = face->size;
    uVar5 = (pFVar6->metrics).x_scale;
    uVar17 = -uVar5;
    if (0 < (long)uVar5) {
      uVar17 = uVar5;
    }
    uVar23 = slot->linearHoriAdvance;
    uVar25 = -uVar23;
    if (0 < (long)uVar23) {
      uVar25 = uVar23;
    }
    uVar25 = uVar25 * uVar17 + 0x20 >> 6;
    uVar17 = -uVar25;
    if (-1 < (long)(uVar5 ^ uVar23)) {
      uVar17 = uVar25;
    }
    uVar5 = slot->linearVertAdvance;
    slot->linearHoriAdvance = uVar17;
    uVar17 = (pFVar6->metrics).y_scale;
    uVar23 = -uVar17;
    if (0 < (long)uVar17) {
      uVar23 = uVar17;
    }
    uVar25 = -uVar5;
    if (0 < (long)uVar5) {
      uVar25 = uVar5;
    }
    uVar25 = uVar25 * uVar23 + 0x20 >> 6;
    uVar23 = -uVar25;
    if (-1 < (long)(uVar17 ^ uVar5)) {
      uVar23 = uVar25;
    }
    slot->linearVertAdvance = uVar23;
  }
  if ((uVar11 >> 0xb & 1) != 0) goto LAB_0013167a;
  pFVar7 = face->internal;
  uVar19 = pFVar7->transform_flags;
  if (uVar19 == 0) goto LAB_0013167a;
  pFVar8 = (slot->face->driver->root).library;
  pFVar26 = pFVar8->cur_renderer;
  if (pFVar26 == (FT_Renderer_conflict)0x0) {
    FVar20 = slot->format;
LAB_00131605:
    for (pFVar24 = (pFVar8->renderers).head; pFVar24 != (FT_ListNode)0x0; pFVar24 = pFVar24->next) {
      pFVar26 = (FT_Renderer_conflict)pFVar24->data;
      if (pFVar26->glyph_format == FVar20) goto LAB_001315e9;
    }
    if (FVar20 == FT_GLYPH_FORMAT_OUTLINE) {
      if ((uVar19 & 1) != 0) {
        FT_Outline_Transform(&slot->outline,&pFVar7->transform_matrix);
        uVar19 = pFVar7->transform_flags;
      }
      if (((uVar19 & 2) != 0) && (sVar1 = (slot->outline).n_points, iVar14 = (int)sVar1, 0 < sVar1))
      {
        lVar9 = (pFVar7->transform_delta).x;
        lVar10 = (pFVar7->transform_delta).y;
        pFVar22 = (slot->outline).points;
        do {
          pFVar22->x = pFVar22->x + lVar9;
          pFVar22->y = pFVar22->y + lVar10;
          pFVar22 = pFVar22 + 1;
          iVar14 = iVar14 + -1;
        } while (iVar14 != 0);
      }
    }
  }
  else {
    FVar20 = slot->format;
    if (pFVar26->glyph_format != FVar20) goto LAB_00131605;
LAB_001315e9:
    iVar13 = (*pFVar26->clazz->transform_glyph)
                       (pFVar26,slot,&pFVar7->transform_matrix,&pFVar7->transform_delta);
  }
  FT_Vector_Transform(&slot->advance,&pFVar7->transform_matrix);
LAB_0013167a:
  if (iVar13 == 0) {
    iVar13 = 0;
    if ((((uVar11 & 1) == 0) && (slot->format != FT_GLYPH_FORMAT_BITMAP)) &&
       (iVar13 = 0, slot->format != FT_GLYPH_FORMAT_COMPOSITE)) {
      FVar15 = uVar11 >> 0x10 & 0xf;
      render_mode = uVar11 >> 0xb & FT_RENDER_MODE_MONO;
      if (FVar15 != FT_RENDER_MODE_NORMAL) {
        render_mode = FVar15;
      }
      if ((uVar11 & 4) == 0) {
        iVar13 = 0;
        ft_glyphslot_preset_bitmap(slot,render_mode,(FT_Vector *)0x0);
      }
      else {
        if (slot->face != (FT_Face)0x0) {
          FVar12 = FT_Render_Glyph_Internal((slot->face->driver->root).library,slot,render_mode);
          return FVar12;
        }
        iVar13 = 6;
      }
    }
  }
  return iVar13;
}

Assistant:

FT_EXPORT_DEF( FT_Error )
  FT_Load_Glyph( FT_Face   face,
                 FT_UInt   glyph_index,
                 FT_Int32  load_flags )
  {
    FT_Error      error;
    FT_Driver     driver;
    FT_GlyphSlot  slot;
    FT_Library    library;
    FT_Bool       autohint = FALSE;
    FT_Module     hinter;
    TT_Face       ttface = (TT_Face)face;


    if ( !face || !face->size || !face->glyph )
      return FT_THROW( Invalid_Face_Handle );

    /* The validity test for `glyph_index' is performed by the */
    /* font drivers.                                           */

    slot = face->glyph;
    ft_glyphslot_clear( slot );

    driver  = face->driver;
    library = driver->root.library;
    hinter  = library->auto_hinter;

    /* resolve load flags dependencies */

    if ( load_flags & FT_LOAD_NO_RECURSE )
      load_flags |= FT_LOAD_NO_SCALE         |
                    FT_LOAD_IGNORE_TRANSFORM;

    if ( load_flags & FT_LOAD_NO_SCALE )
    {
      load_flags |= FT_LOAD_NO_HINTING |
                    FT_LOAD_NO_BITMAP;

      load_flags &= ~FT_LOAD_RENDER;
    }

    if ( load_flags & FT_LOAD_BITMAP_METRICS_ONLY )
      load_flags &= ~FT_LOAD_RENDER;

    /*
     * Determine whether we need to auto-hint or not.
     * The general rules are:
     *
     * - Do only auto-hinting if we have
     *
     *   - a hinter module,
     *   - a scalable font format dealing with outlines,
     *   - not a tricky font, and
     *   - no transforms except simple slants and/or rotations by
     *     integer multiples of 90 degrees.
     *
     * - Then, auto-hint if FT_LOAD_FORCE_AUTOHINT is set or if we don't
     *   have a native font hinter.
     *
     * - Otherwise, auto-hint for LIGHT hinting mode or if there isn't
     *   any hinting bytecode in the TrueType/OpenType font.
     *
     * - Exception: The font is `tricky' and requires the native hinter to
     *   load properly.
     */

    if ( hinter                                           &&
         !( load_flags & FT_LOAD_NO_HINTING )             &&
         !( load_flags & FT_LOAD_NO_AUTOHINT )            &&
         FT_DRIVER_IS_SCALABLE( driver )                  &&
         FT_DRIVER_USES_OUTLINES( driver )                &&
         !FT_IS_TRICKY( face )                            &&
         ( ( load_flags & FT_LOAD_IGNORE_TRANSFORM )    ||
           ( face->internal->transform_matrix.yx == 0 &&
             face->internal->transform_matrix.xx != 0 ) ||
           ( face->internal->transform_matrix.xx == 0 &&
             face->internal->transform_matrix.yx != 0 ) ) )
    {
      if ( ( load_flags & FT_LOAD_FORCE_AUTOHINT ) ||
           !FT_DRIVER_HAS_HINTER( driver )         )
        autohint = TRUE;
      else
      {
        FT_Render_Mode  mode = FT_LOAD_TARGET_MODE( load_flags );
        FT_Bool         is_light_type1;


        /* only the new Adobe engine (for both CFF and Type 1) is `light'; */
        /* we use `strstr' to catch both `Type 1' and `CID Type 1'         */
        is_light_type1 =
          ft_strstr( FT_Get_Font_Format( face ), "Type 1" ) != NULL   &&
          ((PS_Driver)driver)->hinting_engine == FT_HINTING_ADOBE;

        /* the check for `num_locations' assures that we actually    */
        /* test for instructions in a TTF and not in a CFF-based OTF */
        /*                                                           */
        /* since `maxSizeOfInstructions' might be unreliable, we     */
        /* check the size of the `fpgm' and `prep' tables, too --    */
        /* the assumption is that there don't exist real TTFs where  */
        /* both `fpgm' and `prep' tables are missing                 */
        if ( ( mode == FT_RENDER_MODE_LIGHT           &&
               ( !FT_DRIVER_HINTS_LIGHTLY( driver ) &&
                 !is_light_type1                    ) )         ||
             ( FT_IS_SFNT( face )                             &&
               ttface->num_locations                          &&
               ttface->max_profile.maxSizeOfInstructions == 0 &&
               ttface->font_program_size == 0                 &&
               ttface->cvt_program_size == 0                  ) )
          autohint = TRUE;
      }
    }

    if ( autohint )
    {
      FT_AutoHinter_Interface  hinting;


      /* try to load embedded bitmaps first if available            */
      /*                                                            */
      /* XXX: This is really a temporary hack that should disappear */
      /*      promptly with FreeType 2.1!                           */
      /*                                                            */
      if ( FT_HAS_FIXED_SIZES( face )              &&
           ( load_flags & FT_LOAD_NO_BITMAP ) == 0 )
      {
        error = driver->clazz->load_glyph( slot, face->size,
                                           glyph_index,
                                           load_flags | FT_LOAD_SBITS_ONLY );

        if ( !error && slot->format == FT_GLYPH_FORMAT_BITMAP )
          goto Load_Ok;
      }

      {
        FT_Face_Internal  internal        = face->internal;
        FT_Int            transform_flags = internal->transform_flags;


        /* since the auto-hinter calls FT_Load_Glyph by itself, */
        /* make sure that glyphs aren't transformed             */
        internal->transform_flags = 0;

        /* load auto-hinted outline */
        hinting = (FT_AutoHinter_Interface)hinter->clazz->module_interface;

        error   = hinting->load_glyph( (FT_AutoHinter)hinter,
                                       slot, face->size,
                                       glyph_index, load_flags );

        internal->transform_flags = transform_flags;
      }
    }
    else
    {
      error = driver->clazz->load_glyph( slot,
                                         face->size,
                                         glyph_index,
                                         load_flags );
      if ( error )
        goto Exit;

      if ( slot->format == FT_GLYPH_FORMAT_OUTLINE )
      {
        /* check that the loaded outline is correct */
        error = FT_Outline_Check( &slot->outline );
        if ( error )
          goto Exit;

#ifdef GRID_FIT_METRICS
        if ( !( load_flags & FT_LOAD_NO_HINTING ) )
          ft_glyphslot_grid_fit_metrics( slot,
              FT_BOOL( load_flags & FT_LOAD_VERTICAL_LAYOUT ) );
#endif
      }
    }

  Load_Ok:
    /* compute the advance */
    if ( load_flags & FT_LOAD_VERTICAL_LAYOUT )
    {
      slot->advance.x = 0;
      slot->advance.y = slot->metrics.vertAdvance;
    }
    else
    {
      slot->advance.x = slot->metrics.horiAdvance;
      slot->advance.y = 0;
    }

    /* compute the linear advance in 16.16 pixels */
    if ( ( load_flags & FT_LOAD_LINEAR_DESIGN ) == 0 &&
         FT_IS_SCALABLE( face )                      )
    {
      FT_Size_Metrics*  metrics = &face->size->metrics;


      /* it's tricky! */
      slot->linearHoriAdvance = FT_MulDiv( slot->linearHoriAdvance,
                                           metrics->x_scale, 64 );

      slot->linearVertAdvance = FT_MulDiv( slot->linearVertAdvance,
                                           metrics->y_scale, 64 );
    }

    if ( ( load_flags & FT_LOAD_IGNORE_TRANSFORM ) == 0 )
    {
      FT_Face_Internal  internal = face->internal;


      /* now, transform the glyph image if needed */
      if ( internal->transform_flags )
      {
        /* get renderer */
        FT_Renderer  renderer = ft_lookup_glyph_renderer( slot );


        if ( renderer )
          error = renderer->clazz->transform_glyph(
                                     renderer, slot,
                                     &internal->transform_matrix,
                                     &internal->transform_delta );
        else if ( slot->format == FT_GLYPH_FORMAT_OUTLINE )
        {
          /* apply `standard' transformation if no renderer is available */
          if ( internal->transform_flags & 1 )
            FT_Outline_Transform( &slot->outline,
                                  &internal->transform_matrix );

          if ( internal->transform_flags & 2 )
            FT_Outline_Translate( &slot->outline,
                                  internal->transform_delta.x,
                                  internal->transform_delta.y );
        }

        /* transform advance */
        FT_Vector_Transform( &slot->advance, &internal->transform_matrix );
      }
    }

    /* do we need to render the image or preset the bitmap now? */
    if ( !error                                    &&
         ( load_flags & FT_LOAD_NO_SCALE ) == 0    &&
         slot->format != FT_GLYPH_FORMAT_BITMAP    &&
         slot->format != FT_GLYPH_FORMAT_COMPOSITE )
    {
      FT_Render_Mode  mode = FT_LOAD_TARGET_MODE( load_flags );


      if ( mode == FT_RENDER_MODE_NORMAL   &&
           load_flags & FT_LOAD_MONOCHROME )
        mode = FT_RENDER_MODE_MONO;

      if ( load_flags & FT_LOAD_RENDER )
        error = FT_Render_Glyph( slot, mode );
      else
        ft_glyphslot_preset_bitmap( slot, mode, NULL );
    }

    FT_TRACE5(( "FT_Load_Glyph: index %d, flags %x\n",
                glyph_index, load_flags               ));
    FT_TRACE5(( "  x advance: %f\n", slot->advance.x / 64.0 ));
    FT_TRACE5(( "  y advance: %f\n", slot->advance.y / 64.0 ));
    FT_TRACE5(( "  linear x advance: %f\n",
                slot->linearHoriAdvance / 65536.0 ));
    FT_TRACE5(( "  linear y advance: %f\n",
                slot->linearVertAdvance / 65536.0 ));
    FT_TRACE5(( "  bitmap %dx%d, mode %d\n",
                slot->bitmap.width, slot->bitmap.rows,
                slot->bitmap.pixel_mode               ));

  Exit:
    return error;
  }